

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_cont_helpers.hpp
# Opt level: O0

bool asio_handler_cont_helpers::
     is_continuation<fineftp::FtpSession::endDataReceiving(std::shared_ptr<fineftp::FtpSession::IoFile>)::__0>
               (anon_class_32_2_788f4206_for_handler_ *context)

{
  bool bVar1;
  anon_class_32_2_788f4206_for_handler_ *context_local;
  
  bVar1 = asio::asio_handler_is_continuation(context);
  return bVar1;
}

Assistant:

inline bool is_continuation(Context& context)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  return false;
#else
  using asio::asio_handler_is_continuation;
  return asio_handler_is_continuation(
      asio::detail::addressof(context));
#endif
}